

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O0

void __thiscall
itlib::
flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
::flat_map(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
           *this,initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>
                 init,key_compare *comp,allocator_type *alloc)

{
  iterator iVar1;
  iterator iVar2;
  void *extraout_RDX;
  iterator ppVar3;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  *local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
  *local_88;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  local_80;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  local_78;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  new_end;
  allocator_type *alloc_local;
  key_compare *comp_local;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  *this_local;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>
  init_local;
  
  ppVar3 = init._M_array;
  fmimpl::
  pair_compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less>
  ::pair_compare((pair_compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less>
                  *)this,comp);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
  ::vector(&this->m_container,init,alloc);
  iVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
          ::begin(&this->m_container);
  iVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
          ::end(&this->m_container);
  cmp(this,ppVar3,extraout_RDX);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>,itlib::fmimpl::pair_compare<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less>>
            (iVar1._M_current,iVar2._M_current);
  local_80._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
          ::begin(&this->m_container);
  local_88 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
                ::end(&this->m_container);
  local_90 = this;
  local_78 = std::
             unique<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>,itlib::flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>::flat_map(std::initializer_list<std::pair<std::__cxx11::string,Rml::BoxArea>>,itlib::fmimpl::less_const&,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>const&)::_lambda(std::pair<std::__cxx11::string,Rml::BoxArea>const&,std::pair<std::__cxx11::string,Rml::BoxArea>const&)_1_>
                       (local_80,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
                                  )local_88,(anon_class_8_1_8991fb9c_for__M_comp)this);
  __gnu_cxx::
  __normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>const*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
  ::__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>*>
            ((__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>const*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
              *)&local_98,&local_78);
  local_a8._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
          ::end(&this->m_container);
  __gnu_cxx::
  __normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>const*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
  ::__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>*>
            ((__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>const*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
              *)&local_a0,&local_a8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
  ::erase(&this->m_container,local_98,local_a0);
  return;
}

Assistant:

flat_map(std::initializer_list<value_type> init, const key_compare& comp = key_compare(), const allocator_type& alloc = allocator_type())
        : pair_compare(comp)
        , m_container(std::move(init), alloc)
    {
        std::sort(m_container.begin(), m_container.end(), cmp());
        auto new_end = std::unique(m_container.begin(), m_container.end(), [this](const value_type& a, const value_type& b) {
            return !cmp()(a, b) && !cmp()(b, a);
        });
        m_container.erase(new_end, m_container.end());
    }